

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

void __thiscall cimg_library::CImgDisplay::_map_window(CImgDisplay *this)

{
  Display *pDVar1;
  X11_static *pXVar2;
  byte local_175;
  int local_168 [2];
  XEvent event;
  XWindowAttributes attr;
  bool is_mapped;
  bool is_exposed;
  Display *dpy;
  CImgDisplay *this_local;
  
  pXVar2 = cimg::X11_attr();
  pDVar1 = pXVar2->display;
  attr.screen._7_1_ = 0;
  attr.screen._6_1_ = 0;
  XMapRaised(pDVar1,this->_window);
  do {
    XWindowEvent(pDVar1,this->_window,0x28000,local_168);
    if (local_168[0] == 0xc) {
      attr.screen._7_1_ = 1;
    }
    else if (local_168[0] == 0x13) {
      attr.screen._6_1_ = 1;
    }
    local_175 = 1;
    if ((attr.screen._7_1_ & 1) != 0) {
      local_175 = attr.screen._6_1_ ^ 0xff;
    }
  } while ((local_175 & 1) != 0);
  do {
    XGetWindowAttributes(pDVar1,this->_window,event.pad + 0x17);
    if (attr.colormap._4_4_ != 2) {
      XSync(pDVar1,0);
      cimg::sleep(10);
    }
  } while (attr.colormap._4_4_ != 2);
  this->_window_x = event.pad[0x17]._0_4_;
  this->_window_y = event.pad[0x17]._4_4_;
  return;
}

Assistant:

void _map_window() {
      Display *const dpy = cimg::X11_attr().display;
      bool is_exposed = false, is_mapped = false;
      XWindowAttributes attr;
      XEvent event;
      XMapRaised(dpy,_window);
      do { // Wait for the window to be mapped
        XWindowEvent(dpy,_window,StructureNotifyMask | ExposureMask,&event);
        switch (event.type) {
        case MapNotify : is_mapped = true; break;
        case Expose : is_exposed = true; break;
        }
      } while (!is_exposed || !is_mapped);
      do { // Wait for the window to be visible
        XGetWindowAttributes(dpy,_window,&attr);
        if (attr.map_state!=IsViewable) { XSync(dpy,0); cimg::sleep(10); }
      } while (attr.map_state!=IsViewable);
      _window_x = attr.x;
      _window_y = attr.y;
    }